

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_dissipated_exp_entropy.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  FILE *__stream;
  long in_RSI;
  int in_EDI;
  sunrealtype fixed_h;
  int implicit;
  int relax;
  FILE *UFID;
  sunrealtype t;
  long netf;
  long ncfn;
  long nni;
  long nfeLS;
  long nje;
  long nsetups;
  long nrnlsf;
  long nrnlsi;
  long nrje;
  long nre;
  long nrbf;
  long nrf;
  long nfi;
  long nfe;
  long nst_a;
  long nst;
  void *arkode_mem;
  sunrealtype u_err;
  sunrealtype delta_ent;
  sunrealtype ent;
  sunrealtype ent0;
  sunrealtype *ytdata;
  sunrealtype *ydata;
  SUNLinearSolver LS;
  SUNMatrix A;
  N_Vector ytrue;
  N_Vector y;
  SUNContext ctx;
  sunrealtype abstol;
  sunrealtype reltol;
  sunrealtype tf;
  sunrealtype t0;
  int flag;
  N_Vector y_00;
  int flag_00;
  int iVar2;
  N_Vector y_01;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  long local_a0;
  undefined8 local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double *local_70;
  double *local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  double local_28;
  N_Vector local_20;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_20 = (N_Vector)0x0;
  local_28 = 5.0;
  local_30 = 0x3eb0c6f7a0b5ed8d;
  local_38 = 0x3ddb7cdfd9d7bdbb;
  local_40 = 0;
  local_48 = 0;
  local_50 = 0;
  local_58 = 0;
  local_60 = 0;
  local_98 = 0;
  iVar2 = 1;
  flag_00 = 1;
  y_00 = (N_Vector)0x0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  if (1 < in_EDI) {
    iVar2 = atoi(*(char **)(in_RSI + 8));
  }
  if (2 < local_8) {
    flag_00 = atoi(*(char **)(local_10 + 0x10));
  }
  if (3 < local_8) {
    y_00 = (N_Vector)atof(*(char **)(local_10 + 0x18));
  }
  printf("\nDissipated Exponential Entropy problem:\n");
  if (flag_00 == 0) {
    printf("   method     = ERK\n");
  }
  else {
    printf("   method     = DIRK\n");
  }
  printf("   reltol     = %.1e\n",local_30);
  printf("   abstol     = %.1e\n",local_38);
  if (0.0 < (double)y_00) {
    printf("   fixed h    = %.1e\n",y_00);
  }
  if (iVar2 == 0) {
    printf("   relaxation = OFF\n");
  }
  else {
    printf("   relaxation = ON\n");
  }
  printf("\n");
  local_14 = SUNContext_Create(0,&local_40);
  iVar1 = check_flag(flag_00,(char *)y_00);
  if (iVar1 == 0) {
    local_48 = N_VNew_Serial(2,local_40);
    iVar1 = check_ptr(y_00,(char *)0x10262f);
    if (iVar1 == 0) {
      local_68 = (double *)N_VGetArrayPointer(local_48);
      iVar1 = check_ptr(y_00,(char *)0x10266d);
      if (iVar1 == 0) {
        *local_68 = 1.0;
        local_68[1] = 0.5;
        local_50 = N_VClone(local_48);
        iVar1 = check_ptr(y_00,(char *)0x1026d4);
        if (iVar1 == 0) {
          local_70 = (double *)N_VGetArrayPointer(local_50);
          iVar1 = check_ptr(y_00,(char *)0x102712);
          if (iVar1 == 0) {
            if (flag_00 == 0) {
              local_98 = ARKStepCreate(local_20,f,0,local_48,local_40);
            }
            else {
              local_98 = ARKStepCreate(local_20,0,f,local_48,local_40);
            }
            iVar1 = check_ptr(y_00,(char *)0x1027a6);
            if (iVar1 == 0) {
              local_14 = ARKodeSStolerances(local_30,local_98);
              iVar1 = check_flag(flag_00,(char *)y_00);
              if (iVar1 == 0) {
                if (iVar2 != 0) {
                  local_14 = ARKodeSetRelaxFn(local_98,Ent,JacEnt);
                  iVar1 = check_flag(flag_00,(char *)y_00);
                  if (iVar1 != 0) {
                    return 1;
                  }
                }
                if (flag_00 != 0) {
                  local_58 = SUNDenseMatrix(2,2,local_40);
                  iVar1 = check_ptr(y_00,(char *)0x102898);
                  if (iVar1 != 0) {
                    return 1;
                  }
                  local_60 = SUNLinSol_Dense(local_48,local_58,local_40);
                  iVar1 = check_ptr(y_00,(char *)0x1028e6);
                  if (iVar1 != 0) {
                    return 1;
                  }
                  local_14 = ARKodeSetLinearSolver(local_98,local_60,local_58);
                  iVar1 = check_flag(flag_00,(char *)y_00);
                  if (iVar1 != 0) {
                    return 1;
                  }
                  local_14 = ARKodeSetJacFn(local_98,Jac);
                  iVar1 = check_flag(flag_00,(char *)y_00);
                  if (iVar1 != 0) {
                    return 1;
                  }
                  local_14 = ARKStepSetTableName(local_98,"ARKODE_ARK2_DIRK_3_1_2","ARKODE_ERK_NONE"
                                                );
                  iVar1 = check_flag(flag_00,(char *)y_00);
                  if (iVar1 != 0) {
                    return 1;
                  }
                  local_14 = ARKodeSetNonlinConvCoef(0x3f847ae147ae147b,local_98);
                  iVar1 = check_flag(flag_00,(char *)y_00);
                  if (iVar1 != 0) {
                    return 1;
                  }
                }
                if (0.0 < (double)y_00) {
                  local_14 = ARKodeSetFixedStep(y_00,local_98);
                  iVar1 = check_flag(flag_00,(char *)y_00);
                  if (iVar1 != 0) {
                    return 1;
                  }
                }
                __stream = fopen("ark_dissipated_exp_entropy.txt","w");
                fprintf(__stream,"# vars: t u entropy u_err delta_entropy\n");
                y_01 = local_20;
                local_14 = Ent(local_20,(sunrealtype *)__stream,(void *)CONCAT44(iVar2,flag_00));
                iVar1 = check_flag(flag_00,(char *)y_00);
                if (iVar1 == 0) {
                  fprintf(__stream,"%23.16e %23.16e %23.16e %23.16e %23.16e\n",local_20,*local_68,
                          local_78,0);
                  printf(
                        " step   t              u              e              u_err          delta e\n"
                        );
                  printf(
                        " -------------------------------------------------------------------------------\n"
                        );
                  printf("%5d %14.6e %14.6e %14.6e %14.6e %14.6e\n",y_01,*local_68,local_78,0,0);
                  while ((double)y_01 < local_28) {
                    local_14 = ARKodeEvolve(local_28,local_98,local_48,&stack0xfffffffffffffee0,2);
                    iVar1 = check_flag(flag_00,(char *)y_00);
                    if (iVar1 != 0) break;
                    local_14 = Ent(y_01,(sunrealtype *)__stream,(void *)CONCAT44(iVar2,flag_00));
                    iVar1 = check_flag(flag_00,(char *)y_00);
                    if (iVar1 != 0) {
                      return 1;
                    }
                    local_14 = ans((sunrealtype)CONCAT44(iVar2,flag_00),y_00);
                    iVar1 = check_flag(flag_00,(char *)y_00);
                    if (iVar1 != 0) {
                      return 1;
                    }
                    local_88 = local_80 - local_78;
                    local_90 = *local_68 - *local_70;
                    local_14 = ARKodeGetNumSteps(local_98,&local_a0);
                    check_flag(flag_00,(char *)y_00);
                    if (local_a0 % 0x28 == 0) {
                      printf("%5ld %14.6e %14.6e %14.6e %14.6e %14.6e\n",y_01,*local_68,local_80,
                             local_90,local_88,local_a0);
                    }
                    fprintf(__stream,"%23.16e %23.16e %23.16e %23.16e %23.16e\n",y_01,*local_68,
                            local_80,local_90,local_88);
                  }
                  printf(
                        " -------------------------------------------------------------------------------\n"
                        );
                  fclose(__stream);
                  local_14 = ARKodeGetNumSteps(local_98,&local_a0);
                  check_flag(flag_00,(char *)y_00);
                  local_14 = ARKodeGetNumStepAttempts(local_98,&local_a8);
                  check_flag(flag_00,(char *)y_00);
                  local_14 = ARKodeGetNumErrTestFails(local_98,&local_118);
                  check_flag(flag_00,(char *)y_00);
                  local_14 = ARKStepGetNumRhsEvals(local_98,&local_b0,&local_b8);
                  check_flag(flag_00,(char *)y_00);
                  printf("\nFinal Solver Statistics:\n");
                  printf("   Internal solver steps = %li (attempted = %li)\n",local_a0,local_a8);
                  printf("   Total number of error test failures = %li\n",local_118);
                  printf("   Total RHS evals:  Fe = %li,  Fi = %li\n",local_b0,local_b8);
                  if (flag_00 != 0) {
                    local_14 = ARKodeGetNumNonlinSolvIters(local_98,&local_108);
                    check_flag(flag_00,(char *)y_00);
                    local_14 = ARKodeGetNumNonlinSolvConvFails(local_98,&local_110);
                    check_flag(flag_00,(char *)y_00);
                    local_14 = ARKodeGetNumLinSolvSetups(local_98,&local_f0);
                    check_flag(flag_00,(char *)y_00);
                    local_14 = ARKodeGetNumJacEvals(local_98,&local_f8);
                    check_flag(flag_00,(char *)y_00);
                    local_14 = ARKodeGetNumLinRhsEvals(local_98,&local_100);
                    check_flag(flag_00,(char *)y_00);
                    printf("   Total number of Newton iterations = %li\n",local_108);
                    printf("   Total number of linear solver convergence failures = %li\n",local_110
                          );
                    printf("   Total linear solver setups = %li\n",local_f0);
                    printf("   Total number of Jacobian evaluations = %li\n",local_f8);
                    printf("   Total RHS evals for setting up the linear system = %li\n",local_100);
                  }
                  if (iVar2 != 0) {
                    local_14 = ARKodeGetNumRelaxFnEvals(local_98,&local_d0);
                    check_flag(flag_00,(char *)y_00);
                    local_14 = ARKodeGetNumRelaxJacEvals(local_98,&local_d8);
                    check_flag(flag_00,(char *)y_00);
                    local_14 = ARKodeGetNumRelaxFails(local_98,&local_c0);
                    check_flag(flag_00,(char *)y_00);
                    local_14 = ARKodeGetNumRelaxBoundFails(local_98,&local_c8);
                    check_flag(flag_00,(char *)y_00);
                    local_14 = ARKodeGetNumRelaxSolveFails(local_98,&local_e8);
                    check_flag(flag_00,(char *)y_00);
                    local_14 = ARKodeGetNumRelaxSolveIters(local_98,&local_e0);
                    check_flag(flag_00,(char *)y_00);
                    printf("   Total Relaxation Fn evals    = %li\n",local_d0);
                    printf("   Total Relaxation Jac evals   = %li\n",local_d8);
                    printf("   Total Relaxation fails       = %li\n",local_c0);
                    printf("   Total Relaxation bound fails = %li\n",local_c8);
                    printf("   Total Relaxation NLS fails   = %li\n",local_e8);
                    printf("   Total Relaxation NLS iters   = %li\n",local_e0);
                  }
                  printf("\n");
                  ARKodeFree(&local_98);
                  SUNLinSolFree(local_60);
                  SUNMatDestroy(local_58);
                  N_VDestroy(local_48);
                  N_VDestroy(local_50);
                  SUNContext_Free(&local_40);
                  local_4 = local_14;
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
  /* Error-checking flag */
  int flag;

  /* Initial and final times */
  sunrealtype t0 = SUN_RCONST(0.0);
  sunrealtype tf = SUN_RCONST(5.0);

  /* Relative and absolute tolerances */
  sunrealtype reltol = SUN_RCONST(1.0e-6);
  sunrealtype abstol = SUN_RCONST(1.0e-10);

  /* SUNDIALS context, vector, matrix, and linear solver objects */
  SUNContext ctx     = NULL;
  N_Vector y         = NULL;
  N_Vector ytrue     = NULL;
  SUNMatrix A        = NULL;
  SUNLinearSolver LS = NULL;

  /* Pointer to vector data array */
  sunrealtype* ydata;
  sunrealtype* ytdata;

  /* Initial, current, and change in entropy value */
  sunrealtype ent0, ent, delta_ent;

  /* Solution errors */
  sunrealtype u_err;

  /* ARKODE memory structure */
  void* arkode_mem = NULL;

  /* ARKODE statistics */
  long int nst, nst_a, nfe, nfi;
  long int nrf, nrbf, nre, nrje, nrnlsi, nrnlsf;
  long int nsetups, nje, nfeLS, nni, ncfn, netf;

  /* Output time and file */
  sunrealtype t;
  FILE* UFID;

  /* Command line options */
  int relax           = 1;               /* enable relaxation */
  int implicit        = 1;               /* implicit          */
  sunrealtype fixed_h = SUN_RCONST(0.0); /* adaptive stepping */

  /* -------------------- *
   * Output Problem Setup *
   * -------------------- */

  if (argc > 1) { relax = atoi(argv[1]); }
  if (argc > 2) { implicit = atoi(argv[2]); }
  if (argc > 3) { fixed_h = atof(argv[3]); }

  printf("\nDissipated Exponential Entropy problem:\n");
  if (implicit) { printf("   method     = DIRK\n"); }
  else { printf("   method     = ERK\n"); }
  printf("   reltol     = %.1" ESYM "\n", reltol);
  printf("   abstol     = %.1" ESYM "\n", abstol);
  if (fixed_h > SUN_RCONST(0.0))
  {
    printf("   fixed h    = %.1" ESYM "\n", fixed_h);
  }
  if (relax) { printf("   relaxation = ON\n"); }
  else { printf("   relaxation = OFF\n"); }
  printf("\n");

  /* ------------ *
   * Setup ARKODE *
   * ------------ */

  /* Create the SUNDIALS context object for this simulation */
  flag = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_flag(flag, "SUNContext_Create")) { return 1; }

  /* Create serial vector and set the initial condition values */
  y = N_VNew_Serial(2, ctx);
  if (check_ptr(y, "N_VNew_Serial")) { return 1; }

  ydata = N_VGetArrayPointer(y);
  if (check_ptr(ydata, "N_VGetArrayPointer")) { return 1; }

  ydata[0] = SUN_RCONST(1.0);
  ydata[1] = SUN_RCONST(0.5);

  ytrue = N_VClone(y);
  if (check_ptr(ytrue, "N_VClone")) { return 1; }

  ytdata = N_VGetArrayPointer(ytrue);
  if (check_ptr(ytdata, "N_VGetArrayPointer")) { return 1; }

  /* Initialize ARKStep */
  if (implicit) { arkode_mem = ARKStepCreate(NULL, f, t0, y, ctx); }
  else { arkode_mem = ARKStepCreate(f, NULL, t0, y, ctx); }
  if (check_ptr(arkode_mem, "ARKStepCreate")) { return 1; }

  /* Specify tolerances */
  flag = ARKodeSStolerances(arkode_mem, reltol, abstol);
  if (check_flag(flag, "ARKodeSStolerances")) { return 1; }

  if (relax)
  {
    /* Enable relaxation methods */
    flag = ARKodeSetRelaxFn(arkode_mem, Ent, JacEnt);
    if (check_flag(flag, "ARKodeSetRelaxFn")) { return 1; }
  }

  if (implicit)
  {
    /* Create dense matrix and linear solver */
    A = SUNDenseMatrix(2, 2, ctx);
    if (check_ptr(A, "SUNDenseMatrix")) { return 1; }

    LS = SUNLinSol_Dense(y, A, ctx);
    if (check_ptr(LS, "SUNLinSol_Dense")) { return 1; }

    /* Attach the matrix and linear solver */
    flag = ARKodeSetLinearSolver(arkode_mem, LS, A);
    if (check_flag(flag, "ARKodeSetLinearSolver")) { return 1; }

    /* Set Jacobian routine */
    flag = ARKodeSetJacFn(arkode_mem, Jac);
    if (check_flag(flag, "ARKodeSetJacFn")) { return 1; }

    /* Select a Butcher table with non-negative b values */
    flag = ARKStepSetTableName(arkode_mem, "ARKODE_ARK2_DIRK_3_1_2",
                               "ARKODE_ERK_NONE");
    if (check_flag(flag, "ARKStepSetTableName")) { return 1; }

    /* Tighten nonlinear solver tolerance */
    flag = ARKodeSetNonlinConvCoef(arkode_mem, SUN_RCONST(0.01));
    if (check_flag(flag, "ARKodeSetNonlinConvCoef")) { return 1; }
  }

  if (fixed_h > SUN_RCONST(0.0))
  {
    flag = ARKodeSetFixedStep(arkode_mem, fixed_h);
    if (check_flag(flag, "ARKodeSetFixedStep")) { return 1; }
  }

  /* Open output stream for results, output comment line */
  UFID = fopen("ark_dissipated_exp_entropy.txt", "w");
  fprintf(UFID, "# vars: t u entropy u_err delta_entropy\n");

  /* --------------- *
   * Advance in Time *
   * --------------- */

  /* Initial time */
  t = t0;

  /* Output the initial condition and entropy */
  flag = Ent(y, &ent0, NULL);
  if (check_flag(flag, "Ent")) { return 1; }

  fprintf(UFID,
          "%23.16" ESYM " %23.16" ESYM " %23.16" ESYM " %23.16" ESYM
          " %23.16" ESYM "\n",
          t0, ydata[0], ent0, SUN_RCONST(0.0), SUN_RCONST(0.0));

  printf(" step   t              u              e              u_err          "
         "delta e\n");
  printf(" --------------------------------------------------------------------"
         "-----------\n");
  printf("%5d %14.6" ESYM " %14.6" ESYM " %14.6" ESYM " %14.6" ESYM
         " %14.6" ESYM "\n",
         0, t, ydata[0], ent0, SUN_RCONST(0.0), SUN_RCONST(0.0));

  while (t < tf)
  {
    /* Evolve in time */
    flag = ARKodeEvolve(arkode_mem, tf, y, &t, ARK_ONE_STEP);
    if (check_flag(flag, "ARKodeEvolve")) { break; }

    /* Output solution and errors */
    flag = Ent(y, &ent, NULL);
    if (check_flag(flag, "Ent")) { return 1; }

    flag = ans(t, ytrue);
    if (check_flag(flag, "ans")) { return 1; }

    delta_ent = ent - ent0;
    u_err     = ydata[0] - ytdata[0];

    /* Output to the screen periodically */
    flag = ARKodeGetNumSteps(arkode_mem, &nst);
    check_flag(flag, "ARKodeGetNumSteps");

    if (nst % 40 == 0)
    {
      printf("%5ld %14.6" ESYM " %14.6" ESYM " %14.6" ESYM " %14.6" ESYM
             " %14.6" ESYM "\n",
             nst, t, ydata[0], ent, u_err, delta_ent);
    }

    /* Write all steps to file */
    fprintf(UFID,
            "%23.16" ESYM " %23.16" ESYM " %23.16" ESYM " %23.16" ESYM
            " %23.16" ESYM "\n",
            t, ydata[0], ent, u_err, delta_ent);
  }

  printf(" --------------------------------------------------------------------"
         "-----------\n");
  fclose(UFID);

  /* ------------ *
   * Output Stats *
   * ------------ */

  /* Get final statistics on how the solve progressed */
  flag = ARKodeGetNumSteps(arkode_mem, &nst);
  check_flag(flag, "ARKodeGetNumSteps");

  flag = ARKodeGetNumStepAttempts(arkode_mem, &nst_a);
  check_flag(flag, "ARKodeGetNumStepAttempts");

  flag = ARKodeGetNumErrTestFails(arkode_mem, &netf);
  check_flag(flag, "ARKodeGetNumErrTestFails");

  flag = ARKStepGetNumRhsEvals(arkode_mem, &nfe, &nfi);
  check_flag(flag, "ARKStepGetNumRhsEvals");

  printf("\nFinal Solver Statistics:\n");
  printf("   Internal solver steps = %li (attempted = %li)\n", nst, nst_a);
  printf("   Total number of error test failures = %li\n", netf);
  printf("   Total RHS evals:  Fe = %li,  Fi = %li\n", nfe, nfi);

  if (implicit)
  {
    flag = ARKodeGetNumNonlinSolvIters(arkode_mem, &nni);
    check_flag(flag, "ARKodeGetNumNonlinSolvIters");

    flag = ARKodeGetNumNonlinSolvConvFails(arkode_mem, &ncfn);
    check_flag(flag, "ARKodeGetNumNonlinSolvConvFails");

    flag = ARKodeGetNumLinSolvSetups(arkode_mem, &nsetups);
    check_flag(flag, "ARKodeGetNumLinSolvSetups");

    flag = ARKodeGetNumJacEvals(arkode_mem, &nje);
    check_flag(flag, "ARKodeGetNumJacEvals");

    flag = ARKodeGetNumLinRhsEvals(arkode_mem, &nfeLS);
    check_flag(flag, "ARKodeGetNumLinRhsEvals");

    printf("   Total number of Newton iterations = %li\n", nni);
    printf("   Total number of linear solver convergence failures = %li\n", ncfn);
    printf("   Total linear solver setups = %li\n", nsetups);
    printf("   Total number of Jacobian evaluations = %li\n", nje);
    printf("   Total RHS evals for setting up the linear system = %li\n", nfeLS);
  }

  if (relax)
  {
    flag = ARKodeGetNumRelaxFnEvals(arkode_mem, &nre);
    check_flag(flag, "ARKodeGetNumRelaxFnEvals");

    flag = ARKodeGetNumRelaxJacEvals(arkode_mem, &nrje);
    check_flag(flag, "ARKodeGetNumRelaxJacEvals");

    flag = ARKodeGetNumRelaxFails(arkode_mem, &nrf);
    check_flag(flag, "ARKodeGetNumRelaxFails");

    flag = ARKodeGetNumRelaxBoundFails(arkode_mem, &nrbf);
    check_flag(flag, "ARKodeGetNumRelaxBoundFails");

    flag = ARKodeGetNumRelaxSolveFails(arkode_mem, &nrnlsf);
    check_flag(flag, "ARKodeGetNumRelaxSolveFails");

    flag = ARKodeGetNumRelaxSolveIters(arkode_mem, &nrnlsi);
    check_flag(flag, "ARKodeGetNumRelaxSolveIters");

    printf("   Total Relaxation Fn evals    = %li\n", nre);
    printf("   Total Relaxation Jac evals   = %li\n", nrje);
    printf("   Total Relaxation fails       = %li\n", nrf);
    printf("   Total Relaxation bound fails = %li\n", nrbf);
    printf("   Total Relaxation NLS fails   = %li\n", nrnlsf);
    printf("   Total Relaxation NLS iters   = %li\n", nrnlsi);
  }
  printf("\n");

  /* -------- *
   * Clean up *
   * -------- */

  /* Free ARKODE integrator and SUNDIALS objects */
  ARKodeFree(&arkode_mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  N_VDestroy(y);
  N_VDestroy(ytrue);
  SUNContext_Free(&ctx);

  return flag;
}